

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O1

int ibuf_write(msgbuf *msgbuf)

{
  bool bVar1;
  ibuf *piVar2;
  size_t sVar3;
  int *piVar4;
  size_t *psVar5;
  ulong uVar6;
  ulong uVar7;
  iovec iov [1024];
  iovec local_4018 [1024];
  
  uVar7 = 0;
  memset(local_4018,0,0x4000);
  piVar2 = (msgbuf->bufs).tqh_first;
  if (piVar2 != (ibuf *)0x0) {
    psVar5 = &local_4018[0].iov_len;
    uVar6 = 0;
    do {
      sVar3 = piVar2->rpos;
      ((iovec *)(psVar5 + -1))->iov_base = piVar2->buf + sVar3;
      *psVar5 = piVar2->wpos - sVar3;
      uVar7 = uVar6 + 1;
      piVar2 = (piVar2->entry).tqe_next;
      if (piVar2 == (ibuf *)0x0) break;
      psVar5 = psVar5 + 2;
      bVar1 = uVar6 < 0x3ff;
      uVar6 = uVar7;
    } while (bVar1);
  }
  do {
    sVar3 = writev(msgbuf->fd,local_4018,(int)uVar7);
    if (sVar3 != 0xffffffffffffffff) {
      if (sVar3 == 0) {
        piVar4 = __errno_location();
        *piVar4 = 0;
        return 0;
      }
      msgbuf_drain(msgbuf,sVar3);
      return 1;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  if (*piVar4 == 0x69) {
    *piVar4 = 0xb;
  }
  return -1;
}

Assistant:

int
ibuf_write(struct msgbuf *msgbuf)
{
	struct iovec	 iov[IOV_MAX];
	struct ibuf	*buf;
	unsigned int	 i = 0;
	ssize_t	n;

	bzero(&iov, sizeof(iov));
	TAILQ_FOREACH(buf, &msgbuf->bufs, entry) {
		if (i >= IOV_MAX)
			break;
		iov[i].iov_base = buf->buf + buf->rpos;
		iov[i].iov_len = buf->wpos - buf->rpos;
		i++;
	}

again:
	if ((n = writev(msgbuf->fd, iov, i)) == -1) {
		if (errno == EINTR)
			goto again;
		if (errno == ENOBUFS)
			errno = EAGAIN;
		return (-1);
	}

	if (n == 0) {			/* connection closed */
		errno = 0;
		return (0);
	}

	msgbuf_drain(msgbuf, n);

	return (1);
}